

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O2

unique_ptr<rlottie::Animation,_std::default_delete<rlottie::Animation>_> __thiscall
rlottie::Animation::loadFromData
          (Animation *this,string *jsonData,string *resourcePath,ColorFilter *filter)

{
  _Manager_type p_Var1;
  _Head_base<0UL,_AnimationImpl_*,_false> this_00;
  shared_ptr<rlottie::internal::model::Composition> composition;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  string local_58;
  string local_38;
  
  if (jsonData->_M_string_length == 0) {
    (this->d)._M_t.super___uniq_ptr_impl<AnimationImpl,_std::default_delete<AnimationImpl>_>._M_t.
    super__Tuple_impl<0UL,_AnimationImpl_*,_std::default_delete<AnimationImpl>_>.
    super__Head_base<0UL,_AnimationImpl_*,_false>._M_head_impl = (AnimationImpl *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_38,(string *)jsonData);
    std::__cxx11::string::string((string *)&local_58,(string *)resourcePath);
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_78 = (_Manager_type)0x0;
    local_70 = filter->_M_invoker;
    p_Var1 = (filter->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_88._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(filter->super__Function_base)._M_functor;
      local_88._8_8_ = *(undefined8 *)((long)&(filter->super__Function_base)._M_functor + 8);
      (filter->super__Function_base)._M_manager = (_Manager_type)0x0;
      filter->_M_invoker = (_Invoker_type)0x0;
      local_78 = p_Var1;
    }
    internal::model::loadFromData
              ((model *)&composition,&local_38,&local_58,(ColorFilter *)&local_88);
    if (local_78 != (_Manager_type)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    if (composition.
        super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      this_00._M_head_impl = (AnimationImpl *)0x0;
    }
    else {
      this_00._M_head_impl = (AnimationImpl *)operator_new(8);
      Animation((Animation *)this_00._M_head_impl);
      local_68 = composition.
                 super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      _Stack_60._M_pi =
           composition.
           super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      composition.
      super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      composition.
      super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      AnimationImpl::init((AnimationImpl *)
                          *(__uniq_ptr_data<AnimationImpl,_std::default_delete<AnimationImpl>,_true,_true>
                            *)&((this_00._M_head_impl)->mLayerList).
                               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                          ,(EVP_PKEY_CTX *)&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
    }
    (this->d)._M_t.super___uniq_ptr_impl<AnimationImpl,_std::default_delete<AnimationImpl>_>._M_t.
    super__Tuple_impl<0UL,_AnimationImpl_*,_std::default_delete<AnimationImpl>_>.
    super__Head_base<0UL,_AnimationImpl_*,_false>._M_head_impl = this_00._M_head_impl;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&composition.
                super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return (__uniq_ptr_data<rlottie::Animation,_std::default_delete<rlottie::Animation>,_true,_true>)
         (__uniq_ptr_data<rlottie::Animation,_std::default_delete<rlottie::Animation>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Animation> Animation::loadFromData(std::string jsonData,
                                                   std::string resourcePath,
                                                   ColorFilter filter)
{
    if (jsonData.empty()) {
        vWarning << "jason data is empty";
        return nullptr;
    }

    auto composition = model::loadFromData(
        std::move(jsonData), std::move(resourcePath), std::move(filter));
    if (composition) {
        auto animation = std::unique_ptr<Animation>(new Animation);
        animation->d->init(std::move(composition));
        return animation;
    }
    return nullptr;
}